

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O0

bool xor8_contain(uint64_t key,xor8_t *filter)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint64_t hash_00;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long in_RSI;
  uint32_t h2;
  uint32_t h1;
  uint32_t h0;
  uint32_t r2;
  uint32_t r1;
  uint32_t r0;
  uint8_t f;
  uint64_t hash;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  hash_00 = xor_mix_split(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar4 = xor_fingerprint(hash_00);
  uVar5 = xor_rotl64(hash_00,0x15);
  uVar6 = xor_rotl64(hash_00,0x2a);
  uVar1 = xor_reduce((uint32_t)hash_00,(uint32_t)*(undefined8 *)(in_RSI + 8));
  uVar2 = xor_reduce((uint32_t)uVar5,(uint32_t)*(undefined8 *)(in_RSI + 8));
  uVar3 = uVar2 + (int)*(undefined8 *)(in_RSI + 8);
  uVar2 = xor_reduce((uint32_t)uVar6,(uint32_t)*(undefined8 *)(in_RSI + 8));
  return (byte)uVar4 ==
         (byte)(*(byte *)(*(long *)(in_RSI + 0x10) + (ulong)uVar1) ^
                *(byte *)(*(long *)(in_RSI + 0x10) + (ulong)uVar3) ^
               *(byte *)(*(long *)(in_RSI + 0x10) +
                        (ulong)(uVar2 + (int)*(undefined8 *)(in_RSI + 8) * 2)));
}

Assistant:

static inline bool xor8_contain(uint64_t key, const xor8_t *filter) {
  uint64_t hash = xor_mix_split(key, filter->seed);
  uint8_t f = xor_fingerprint(hash);
  uint32_t r0 = (uint32_t)hash;
  uint32_t r1 = (uint32_t)xor_rotl64(hash, 21);
  uint32_t r2 = (uint32_t)xor_rotl64(hash, 42);
  uint32_t h0 = xor_reduce(r0, filter->blockLength);
  uint32_t h1 = xor_reduce(r1, filter->blockLength) + filter->blockLength;
  uint32_t h2 = xor_reduce(r2, filter->blockLength) + 2 * filter->blockLength;
  return f == (filter->fingerprints[h0] ^ filter->fingerprints[h1] ^
       filter->fingerprints[h2]);
}